

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddGroupMove(DdManager *table,int x,int y,Move **moves)

{
  uint uVar1;
  Move *pMVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdNode *pDVar6;
  DdHalfWord local_60;
  DdHalfWord local_5c;
  int swapy;
  int swapx;
  int newxtop;
  int ysize;
  int ybot;
  int ytop;
  int xsize;
  int xbot;
  int xtop;
  int j;
  int i;
  int size;
  Move *move;
  Move **moves_local;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  local_5c = 0xffffffff;
  local_60 = 0xffffffff;
  uVar1 = table->subtableZ[x].next;
  for (newxtop = y; (uint)newxtop < table->subtableZ[newxtop].next;
      newxtop = table->subtableZ[newxtop].next) {
  }
  moves_local._0_4_ = y;
  moves_local._4_4_ = x;
  for (xtop = 1; xtop <= (newxtop - y) + 1; xtop = xtop + 1) {
    for (xbot = 1; xbot <= (int)((x - uVar1) + 1); xbot = xbot + 1) {
      iVar3 = cuddZddSwapInPlace(table,moves_local._4_4_,(uint)moves_local);
      if (iVar3 == 0) goto LAB_00c0ec60;
      local_5c = moves_local._4_4_;
      local_60 = (uint)moves_local;
      moves_local._0_4_ = moves_local._4_4_;
      moves_local._4_4_ = cuddZddNextLow(table,moves_local._4_4_);
    }
    moves_local._0_4_ = y + xtop;
    moves_local._4_4_ = cuddZddNextLow(table,(uint)moves_local);
  }
  moves_local._0_4_ = uVar1;
  for (xtop = 0; xtop < newxtop - y; xtop = xtop + 1) {
    uVar4 = cuddZddNextHigh(table,(uint)moves_local);
    table->subtableZ[(int)(uint)moves_local].next = uVar4;
    moves_local._0_4_ = cuddZddNextHigh(table,(uint)moves_local);
  }
  table->subtableZ[(int)(uint)moves_local].next = uVar1;
  uVar4 = cuddZddNextHigh(table,(uint)moves_local);
  moves_local._4_4_ = uVar4;
  for (xtop = 0; xtop < (int)(x - uVar1); xtop = xtop + 1) {
    uVar5 = cuddZddNextHigh(table,moves_local._4_4_);
    table->subtableZ[(int)moves_local._4_4_].next = uVar5;
    moves_local._4_4_ = cuddZddNextHigh(table,moves_local._4_4_);
  }
  table->subtableZ[(int)moves_local._4_4_].next = uVar4;
  pDVar6 = cuddDynamicAllocNode(table);
  if (pDVar6 == (DdNode *)0x0) {
LAB_00c0ec60:
    while (*moves != (Move *)0x0) {
      pMVar2 = (*moves)->next;
      (*moves)->y = 0;
      *(DdNode **)&(*moves)->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar2;
    }
    table_local._4_4_ = 0;
  }
  else {
    pDVar6->index = local_5c;
    pDVar6->ref = local_60;
    *(undefined4 *)&pDVar6->next = 0;
    *(uint *)((long)&pDVar6->next + 4) = table->keysZ;
    (pDVar6->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar6;
    table_local._4_4_ = table->keysZ;
  }
  return table_local._4_4_;
}

Assistant:

static int
zddGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size;
    int  i,j,xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx=-1,swapy=-1;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    int  initialSize,bestSize;
#endif

#ifdef DD_DEBUG
    /* We assume that x < y */
    assert(x < y);
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtableZ[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtableZ[ybot].next)
        ybot = table->subtableZ[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    initialSize = bestSize = table->keysZ;
#endif
    /* Sift the variables of the second group up through the first group */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddZddSwapInPlace(table,x,y);
            if (size == 0) goto zddGroupMoveOutOfMem;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            if (size < bestSize)
                bestSize = size;
#endif
            swapx = x; swapy = y;
            y = x;
            x = cuddZddNextLow(table,y);
        }
        y = ytop + i;
        x = cuddZddNextLow(table,y);
    }
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if ((bestSize < initialSize) && (bestSize < size))
        (void) fprintf(table->out,"Missed local minimum: initialSize:%d  bestSize:%d  finalSize:%d\n",initialSize,bestSize,size);
#endif

    /* fix groups */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize - 1; i++) {
        table->subtableZ[y].next = cuddZddNextHigh(table,y);
        y = cuddZddNextHigh(table,y);
    }
    table->subtableZ[y].next = xtop; /* y is bottom of its group, join */
                                    /* it to top of its group */
    x = cuddZddNextHigh(table,y);
    newxtop = x;
    for (i = 0; i < xsize - 1; i++) {
        table->subtableZ[x].next = cuddZddNextHigh(table,x);
        x = cuddZddNextHigh(table,x);
    }
    table->subtableZ[x].next = newxtop; /* x is bottom of its group, join */
                                    /* it to top of its group */
#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddGroupMove:\n");
#endif

    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) goto zddGroupMoveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->flags = MTR_DEFAULT;
    move->size = table->keysZ;
    move->next = *moves;
    *moves = move;

    return(table->keysZ);

zddGroupMoveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}